

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_set_diagonal(Integer g_a,Integer g_v)

{
  int iVar1;
  int iVar2;
  _iterator_hdl hdl;
  char *ptr;
  int local_sync_end;
  int local_sync_begin;
  Integer num_blocks_a;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer adims [2];
  Integer andim;
  Integer nproc;
  Integer i;
  Integer me;
  Integer type;
  Integer atype;
  Integer vtype;
  Integer dim2;
  Integer dim1;
  Integer vdims;
  Integer vndim;
  undefined8 local_3c8;
  Integer *in_stack_fffffffffffffc68;
  char **in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc78;
  Integer *in_stack_fffffffffffffc80;
  _iterator_hdl *in_stack_fffffffffffffc88;
  _iterator_hdl *in_stack_fffffffffffffcf8;
  Integer in_stack_fffffffffffffd00;
  Integer in_stack_fffffffffffffd08;
  Integer *in_stack_fffffffffffffd10;
  Integer *in_stack_fffffffffffffd18;
  Integer in_stack_fffffffffffffd20;
  void *in_stack_fffffffffffffd28;
  Integer in_stack_fffffffffffffd30;
  Integer in_stack_fffffffffffffd40;
  Integer in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffe28;
  Integer in_stack_fffffffffffffe30;
  Integer *in_stack_fffffffffffffe38;
  Integer *in_stack_fffffffffffffe40;
  Integer *in_stack_fffffffffffffe48;
  Integer in_stack_fffffffffffffe50;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_18;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pnga_check_handle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pnga_inquire(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
  pnga_inquire(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
  if (local_68 != 2) {
    pnga_error(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  if (local_18 != 1) {
    pnga_error(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  if (local_70 < local_78) {
    local_3c8 = local_70;
  }
  else {
    local_3c8 = local_78;
  }
  if (local_20 != local_3c8) {
    pnga_error(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  if (local_38 != local_40) {
    pnga_error(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  pnga_local_iterator_init(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  while( true ) {
    iVar2 = pnga_local_iterator_next
                      (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78
                       ,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    if (iVar2 == 0) break;
    sgai_set_diagonal_block
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
               in_stack_fffffffffffffd40);
  }
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_set_diagonal(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_set_diagonal_");
  pnga_check_handle (g_v, "ga_set_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_set_diagonal: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_set_diagonal: wrong dimension for g_v.", vndim);


  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_set_diagonal: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_set_diagonal: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_set_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }

  }
#endif
  if(local_sync_end)pnga_sync();
}